

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_block_tests.cpp
# Opt level: O0

shared_ptr<CBlock> __thiscall
validation_block_tests::MinerTestingSetup::Block(MinerTestingSetup *this,uint256 *prev_hash)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  uint32_t uVar6;
  element_type *peVar7;
  reference pvVar8;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Chainstate *in_RDI;
  long in_FS_OFFSET;
  shared_ptr<CBlock> sVar9;
  shared_ptr<CBlock> *pblock;
  CMutableTransaction txCoinbase;
  unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> ptemplate;
  Options options;
  CChainParams *in_stack_fffffffffffffd98;
  CMutableTransaction *in_stack_fffffffffffffda0;
  ChainstateManager *in_stack_fffffffffffffda8;
  size_type in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  CTransaction *in_stack_fffffffffffffdc0;
  CAmount CVar10;
  CBlock *in_stack_fffffffffffffdc8;
  anon_class_16_2_333ed407 *this_00;
  opcodetype opcode;
  CScript *in_stack_fffffffffffffdd0;
  CScript *pCVar11;
  CBlock *in_stack_fffffffffffffe10;
  CChainParams *in_stack_fffffffffffffe18;
  Chainstate *this_01;
  anon_class_16_2_333ed407 local_168 [17];
  CScript *in_stack_ffffffffffffffa8;
  BlockAssembler *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  if ((Block(uint256_const&)::time == '\0') &&
     (iVar5 = __cxa_guard_acquire(&Block(uint256_const&)::time), iVar5 != 0)) {
    in_stack_fffffffffffffe18 = Params();
    in_stack_fffffffffffffe10 = CChainParams::GenesisBlock(in_stack_fffffffffffffd98);
    Block::time = (uint64_t)(in_stack_fffffffffffffe10->super_CBlockHeader).nTime;
    __cxa_guard_release(&Block(uint256_const&)::time);
  }
  ::node::BlockAssembler::Options::Options((Options *)in_stack_fffffffffffffd98);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffffd98);
  ChainstateManager::ActiveChainstate(in_stack_fffffffffffffda8);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::get
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_fffffffffffffd98);
  ::node::BlockAssembler::BlockAssembler
            ((BlockAssembler *)this_01,in_RDI,(CTxMemPool *)in_stack_fffffffffffffe18,
             (Options *)in_stack_fffffffffffffe10);
  CScript::CScript((CScript *)in_stack_fffffffffffffd98);
  Block::i = Block::i + 1;
  CScript::operator<<((CScript *)in_stack_fffffffffffffda8,(int64_t)in_stack_fffffffffffffda0);
  CScript::operator<<(in_stack_fffffffffffffdd0,
                      (opcodetype)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
  ::node::BlockAssembler::CreateNewBlock(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  CScript::~CScript((CScript *)in_stack_fffffffffffffd98);
  ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)in_stack_fffffffffffffd98);
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::operator->
            ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
             in_stack_fffffffffffffd98);
  std::make_shared<CBlock,CBlock&>(in_stack_fffffffffffffdc8);
  peVar7 = std::__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      in_stack_fffffffffffffd98);
  uVar2 = *in_RDX;
  uVar3 = in_RDX[1];
  uVar4 = in_RDX[3];
  *(undefined8 *)
   ((peVar7->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x10) =
       in_RDX[2];
  *(undefined8 *)
   ((peVar7->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar4
  ;
  *(undefined8 *)(peVar7->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems =
       uVar2;
  *(undefined8 *)
   ((peVar7->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 8) = uVar3;
  Block::time = Block::time + 1;
  uVar6 = (uint32_t)Block::time;
  peVar7 = std::__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      in_stack_fffffffffffffd98);
  (peVar7->super_CBlockHeader).nTime = uVar6;
  std::__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffd98);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_fffffffffffffda8,(size_type)in_stack_fffffffffffffda0);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffda8);
  CMutableTransaction::CMutableTransaction
            ((CMutableTransaction *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),in_stack_fffffffffffffdb0
            );
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffda8,
             (size_type)in_stack_fffffffffffffda0);
  CScript::operator=((CScript *)in_stack_fffffffffffffda8,(CScript *)in_stack_fffffffffffffda0);
  this_00 = local_168;
  pCVar11 = (CScript *)0x0;
  pvVar8 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffda8,
                      (size_type)in_stack_fffffffffffffda0);
  CVar10 = pvVar8->nValue;
  pvVar8 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffda8,
                      (size_type)in_stack_fffffffffffffda0);
  pvVar8->nValue = CVar10;
  pvVar8 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffda8,
                      (size_type)in_stack_fffffffffffffda0);
  pvVar8->nValue = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffda8,
             (size_type)in_stack_fffffffffffffda0);
  CScriptWitness::SetNull((CScriptWitness *)in_stack_fffffffffffffd98);
  CScript::CScript((CScript *)in_stack_fffffffffffffd98);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffd98);
  Block::anon_class_16_2_333ed407::operator()(this_00);
  opcode = (opcodetype)((ulong)this_00 >> 0x20);
  CScript::operator<<((CScript *)in_stack_fffffffffffffda8,(int64_t)in_stack_fffffffffffffda0);
  pCVar11 = CScript::operator<<(pCVar11,opcode);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)pCVar11,(size_type)in_stack_fffffffffffffda0);
  CScript::operator=(pCVar11,(CScript *)in_stack_fffffffffffffda0);
  CScript::~CScript((CScript *)in_stack_fffffffffffffd98);
  ::MakeTransactionRef<CMutableTransaction>(in_stack_fffffffffffffda0);
  std::__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffd98);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)pCVar11,(size_type)in_stack_fffffffffffffda0);
  std::shared_ptr<const_CTransaction>::operator=
            ((shared_ptr<const_CTransaction> *)pCVar11,
             (shared_ptr<const_CTransaction> *)in_stack_fffffffffffffda0);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffd98);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffffd98);
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
            ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)pCVar11
            );
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  sVar9.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar9.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this_01;
  return (shared_ptr<CBlock>)sVar9.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CBlock> MinerTestingSetup::Block(const uint256& prev_hash)
{
    static int i = 0;
    static uint64_t time = Params().GenesisBlock().nTime;

    BlockAssembler::Options options;
    auto ptemplate = BlockAssembler{m_node.chainman->ActiveChainstate(), m_node.mempool.get(), options}.CreateNewBlock(CScript{} << i++ << OP_TRUE);
    auto pblock = std::make_shared<CBlock>(ptemplate->block);
    pblock->hashPrevBlock = prev_hash;
    pblock->nTime = ++time;

    // Make the coinbase transaction with two outputs:
    // One zero-value one that has a unique pubkey to make sure that blocks at the same height can have a different hash
    // Another one that has the coinbase reward in a P2WSH with OP_TRUE as witness program to make it easy to spend
    CMutableTransaction txCoinbase(*pblock->vtx[0]);
    txCoinbase.vout.resize(2);
    txCoinbase.vout[1].scriptPubKey = P2WSH_OP_TRUE;
    txCoinbase.vout[1].nValue = txCoinbase.vout[0].nValue;
    txCoinbase.vout[0].nValue = 0;
    txCoinbase.vin[0].scriptWitness.SetNull();
    // Always pad with OP_0 at the end to avoid bad-cb-length error
    txCoinbase.vin[0].scriptSig = CScript{} << WITH_LOCK(::cs_main, return m_node.chainman->m_blockman.LookupBlockIndex(prev_hash)->nHeight + 1) << OP_0;
    pblock->vtx[0] = MakeTransactionRef(std::move(txCoinbase));

    return pblock;
}